

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::CheckLeaksOnProcessDetach(Recycler *this,char16 *header)

{
  CollectionState CVar1;
  
  if (this->recyclerFlagsTable->CheckMemoryLeak != true) {
    return;
  }
  (**(((this->markContext).pagePool)->pageAllocator)._vptr_PageAllocatorBase)();
  CVar1 = (this->collectionState).value;
  if ((CVar1 >> 0xd & 1) != 0) {
    AbortConcurrent(this,true);
    CVar1 = (this->collectionState).value;
  }
  if (CVar1 != CollectionStateNotCollecting) {
    Output::Print(L"WARNING: Thread terminated during GC.  Can\'t dump object graph\n");
    return;
  }
  this->externalRootMarker = (ExternalRootMarker)0x0;
  this->externalRootMarkerContext = (void *)0x0;
  ResetThreadId(this);
  CheckLeaks(this,header);
  return;
}

Assistant:

void
Recycler::CheckLeaksOnProcessDetach(char16 const * header)
{
    if (GetRecyclerFlagsTable().CheckMemoryLeak)
    {
        ReportOnProcessDetach([=]() { this->CheckLeaks(header); });
    }
}